

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi__zbuild_huffman(stbi__zhuffman *z,stbi_uc *sizelist,int num)

{
  byte bVar1;
  int iVar2;
  undefined1 auVar3 [64];
  ulong uVar4;
  long lVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int sizes [17];
  int next_code [16];
  undefined1 local_c8 [64];
  undefined4 local_88;
  int aiStack_78 [18];
  
  local_c8 = vmovdqu64_avx512f(ZEXT1664((undefined1  [16])0x0));
  local_88 = 0;
  memset(z,0,0x400);
  if (0 < num) {
    uVar4 = 0;
    do {
      *(int *)(local_c8 + (ulong)sizelist[uVar4] * 4) =
           *(int *)(local_c8 + (ulong)sizelist[uVar4] * 4) + 1;
      uVar4 = uVar4 + 1;
    } while ((uint)num != uVar4);
  }
  auVar3._60_4_ = 0;
  auVar3._0_60_ = local_c8._4_60_;
  local_c8 = auVar3 << 0x20;
  lVar5 = 1;
  do {
    if (1 << ((uint)lVar5 & 0x1f) < *(int *)(local_c8 + lVar5 * 4)) {
      stbi__g_failure_reason = "bad sizes";
      return 0;
    }
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x10);
  lVar5 = 0;
  uVar6 = 0xf;
  iVar7 = 0;
  iVar8 = 0;
  while( true ) {
    aiStack_78[lVar5 + 1] = iVar8;
    z->firstcode[lVar5 + 1] = (stbi__uint16)iVar8;
    z->firstsymbol[lVar5 + 1] = (stbi__uint16)iVar7;
    iVar2 = *(int *)(local_c8 + lVar5 * 4 + 4);
    iVar8 = iVar8 + iVar2;
    if ((iVar2 != 0) && (1 << ((int)lVar5 + 1U & 0x1f) < iVar8)) break;
    z->maxcode[lVar5 + 1] = iVar8 << (uVar6 & 0x1f);
    iVar8 = iVar8 * 2;
    iVar7 = iVar7 + iVar2;
    uVar6 = uVar6 - 1;
    lVar5 = lVar5 + 1;
    if (lVar5 == 0xf) {
      z->maxcode[0x10] = 0x10000;
      if (0 < num) {
        uVar4 = 0;
        vpmovsxbq_avx512f(ZEXT816(0x1f1e1d1c1b1a1918));
        vpmovsxbq_avx512f(ZEXT816(0x1716151413121110));
        vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
        vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        do {
          bVar1 = sizelist[uVar4];
          if (bVar1 != 0) {
            iVar8 = aiStack_78[bVar1];
            lVar5 = (long)(int)(iVar8 - (uint)z->firstcode[bVar1]) + (ulong)z->firstsymbol[bVar1];
            z->size[lVar5] = bVar1;
            z->value[lVar5] = (stbi__uint16)uVar4;
            if (bVar1 < 10) {
              halt_baddata();
            }
            aiStack_78[bVar1] = iVar8 + 1;
          }
          uVar4 = uVar4 + 1;
        } while (uVar4 != (uint)num);
      }
      return 1;
    }
  }
  stbi__g_failure_reason = "bad codelengths";
  return 0;
}

Assistant:

static int stbi__zbuild_huffman(stbi__zhuffman *z, const stbi_uc *sizelist, int num)
{
   int i,k=0;
   int code, next_code[16], sizes[17];

   // DEFLATE spec for generating codes
   memset(sizes, 0, sizeof(sizes));
   memset(z->fast, 0, sizeof(z->fast));
   for (i=0; i < num; ++i)
      ++sizes[sizelist[i]];
   sizes[0] = 0;
   for (i=1; i < 16; ++i)
      if (sizes[i] > (1 << i))
         return stbi__err("bad sizes", "Corrupt PNG");
   code = 0;
   for (i=1; i < 16; ++i) {
      next_code[i] = code;
      z->firstcode[i] = (stbi__uint16) code;
      z->firstsymbol[i] = (stbi__uint16) k;
      code = (code + sizes[i]);
      if (sizes[i])
         if (code-1 >= (1 << i)) return stbi__err("bad codelengths","Corrupt PNG");
      z->maxcode[i] = code << (16-i); // preshift for inner loop
      code <<= 1;
      k += sizes[i];
   }
   z->maxcode[16] = 0x10000; // sentinel
   for (i=0; i < num; ++i) {
      int s = sizelist[i];
      if (s) {
         int c = next_code[s] - z->firstcode[s] + z->firstsymbol[s];
         stbi__uint16 fastv = (stbi__uint16) ((s << 9) | i);
         z->size [c] = (stbi_uc     ) s;
         z->value[c] = (stbi__uint16) i;
         if (s <= STBI__ZFAST_BITS) {
            int j = stbi__bit_reverse(next_code[s],s);
            while (j < (1 << STBI__ZFAST_BITS)) {
               z->fast[j] = fastv;
               j += (1 << s);
            }
         }
         ++next_code[s];
      }
   }
   return 1;
}